

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O1

int Extra_bddNodePathsUnderCutArray
              (DdManager *dd,DdNode **paNodes,DdNode **pbCubes,int nNodes,DdNode **paNodesRes,
              DdNode **pbCubesRes,int CutLevel)

{
  st__table *CutNodes;
  DdManager *table;
  DdNode **ppDVar1;
  DdNode **ppDVar2;
  int iVar3;
  st__table *psVar4;
  st__generator *psVar5;
  long lVar6;
  DdNode *n;
  ulong uVar7;
  ulong uVar8;
  traventry *p;
  DdNode *local_68;
  DdNode *local_60;
  st__table *local_58;
  DdManager *local_50;
  DdNode **local_48;
  DdNode **local_40;
  DdNode **local_38;
  
  s_CutLevel = CutLevel;
  if (nNodes < 1) {
    __assert_fail("nNodes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddCas.c"
                  ,0x16c,
                  "int Extra_bddNodePathsUnderCutArray(DdManager *, DdNode **, DdNode **, int, DdNode **, DdNode **, int)"
                 );
  }
  if ((nNodes == 1) && (*(int *)((ulong)*paNodes & 0xfffffffffffffffe) == 0x7fffffff)) {
    if (*paNodes == dd->one) {
      *paNodesRes = dd->one;
      n = dd->one;
    }
    else {
      *paNodesRes = dd->zero;
      n = dd->zero;
    }
    Cudd_Ref(n);
    *pbCubesRes = *pbCubes;
    Cudd_Ref(*pbCubes);
    iVar3 = 1;
  }
  else {
    local_48 = paNodesRes;
    local_40 = pbCubesRes;
    local_38 = pbCubes;
    local_58 = st__init_table(st__ptrcmp,st__ptrhash);
    psVar4 = st__init_table(st__ptrcmp,st__ptrhash);
    uVar7 = 1;
    if (1 < nNodes) {
      uVar7 = (ulong)(uint)nNodes;
    }
    uVar8 = 0;
    do {
      CountNodeVisits_rec(dd,paNodes[uVar8],psVar4);
      ppDVar1 = local_38;
      CutNodes = local_58;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
    uVar7 = 1;
    if (1 < nNodes) {
      uVar7 = (ulong)(uint)nNodes;
    }
    uVar8 = 0;
    local_50 = dd;
    do {
      CollectNodesAndComputePaths_rec(local_50,paNodes[uVar8],ppDVar1[uVar8],psVar4,CutNodes);
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
    psVar5 = st__init_gen(psVar4);
    iVar3 = st__gen(psVar5,(char **)&local_60,(char **)&local_68);
    table = local_50;
    if (iVar3 != 0) {
      do {
        Cudd_RecursiveDeref(table,local_68->next);
        if (local_68 != (DdNode *)0x0) {
          free(local_68);
          local_68 = (DdNode *)0x0;
        }
        iVar3 = st__gen(psVar5,(char **)&local_60,(char **)&local_68);
      } while (iVar3 != 0);
    }
    st__free_gen(psVar5);
    st__free_table(psVar4);
    psVar4 = local_58;
    psVar5 = st__init_gen(local_58);
    iVar3 = st__gen(psVar5,(char **)&local_60,(char **)&local_68);
    ppDVar2 = local_40;
    ppDVar1 = local_48;
    lVar6 = 0;
    if (iVar3 != 0) {
      do {
        ppDVar1[lVar6] = local_60;
        Cudd_Ref(local_60);
        ppDVar2[lVar6] = local_68;
        lVar6 = lVar6 + 1;
        iVar3 = st__gen(psVar5,(char **)&local_60,(char **)&local_68);
        psVar4 = local_58;
      } while (iVar3 != 0);
    }
    iVar3 = (int)lVar6;
    st__free_gen(psVar5);
    st__free_table(psVar4);
  }
  return iVar3;
}

Assistant:

int Extra_bddNodePathsUnderCutArray( DdManager * dd, DdNode ** paNodes, DdNode ** pbCubes, int nNodes, DdNode ** paNodesRes, DdNode ** pbCubesRes, int CutLevel )
{
    st__table * Visited;  // temporary table to remember the visited nodes
    st__table * CutNodes; // the nodes under the cut go here
    int i, Counter;

    s_CutLevel = CutLevel;

    // there should be some nodes
    assert( nNodes > 0 );
    if ( nNodes == 1 && Cudd_IsConstant( paNodes[0] ) )
    {
        if ( paNodes[0] == a1 )
        {
            paNodesRes[0] = a1;          Cudd_Ref( a1 );
            pbCubesRes[0] = pbCubes[0];  Cudd_Ref( pbCubes[0] );
        }
        else
        {
            paNodesRes[0] = a0;          Cudd_Ref( a0 );
            pbCubesRes[0] = pbCubes[0];  Cudd_Ref( pbCubes[0] );
        }
        return 1;
    }

    // Step 1: Start the table and collect information about the nodes above the cut 
    // this information tells how many edges point to each node
    CutNodes = st__init_table( st__ptrcmp, st__ptrhash);;
    Visited  = st__init_table( st__ptrcmp, st__ptrhash);;

    for ( i = 0; i < nNodes; i++ )
        CountNodeVisits_rec( dd, paNodes[i], Visited );

    // Step 2: Traverse the BDD using the visited table and compute the sum of paths
    for ( i = 0; i < nNodes; i++ )
        CollectNodesAndComputePaths_rec( dd, paNodes[i], pbCubes[i], Visited, CutNodes );

    // at this point, the table of cut nodes is ready and the table of visited is useless
    {
        st__generator * gen;
        DdNode * aNode;
        traventry * p;
        st__foreach_item( Visited, gen, (const char**)&aNode, (char**)&p )
        {
            Cudd_RecursiveDeref( dd, p->bSum );
            ABC_FREE( p );
        }
        st__free_table( Visited );
    }

    // go through the table CutNodes and create the BDD and the path to be returned
    {
        st__generator * gen;
        DdNode * aNode, * bSum;
        Counter = 0;
        st__foreach_item( CutNodes, gen, (const char**)&aNode, (char**)&bSum)
        {
            paNodesRes[Counter] = aNode;   Cudd_Ref( aNode ); 
            pbCubesRes[Counter] = bSum;
            Counter++;
        }
        st__free_table( CutNodes );
    }

    // return the number of cofactors found
    return Counter;

}